

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,wchar_t *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  wchar_t *mode;
  auto_deleter<_IO_FILE> file;
  auto_deleter<_IO_FILE> local_30;
  
  mode = L"w";
  if ((flags & 0x20) == 0) {
    mode = L"wb";
  }
  local_30.data = impl::anon_unknown_0::open_file_wide(path_,mode);
  local_30.deleter = impl::anon_unknown_0::close_file;
  bVar1 = impl::anon_unknown_0::save_file_impl(this,local_30.data,indent,flags,encoding);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter(&local_30);
  return bVar1;
}

Assistant:

PUGI__FN bool xml_document::save_file(const wchar_t* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file_wide(path_, (flags & format_save_file_text) ? L"w" : L"wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding);
	}